

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTcpIpConnection.cxx
# Opt level: O0

void __thiscall cmTcpIpConnection::~cmTcpIpConnection(cmTcpIpConnection *this)

{
  cmTcpIpConnection *this_local;
  
  ~cmTcpIpConnection(this);
  operator_delete(this,0x70);
  return;
}

Assistant:

cmTcpIpConnection::~cmTcpIpConnection()
{
}